

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double beta_inc(double a,double b,double x)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double local_90;
  double xx;
  double value;
  double tol;
  double term;
  double temp;
  double rx;
  double qq;
  double psq;
  double pp;
  bool local_3d;
  int ns;
  int iStack_38;
  bool indx;
  int it_max;
  int it;
  int i;
  double cx;
  double x_local;
  double b_local;
  double a_local;
  
  if (a <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  A <= 0.\n");
    exit(1);
  }
  if (0.0 < b) {
    if (0.0 < x) {
      if (x < 1.0) {
        qq = a + b;
        local_3d = (a + b) * x <= a;
        if (local_3d) {
          _it = 1.0 - x;
          local_90 = x;
          rx = b;
          psq = a;
        }
        else {
          local_90 = 1.0 - x;
          rx = a;
          psq = b;
          _it = x;
        }
        local_3d = !local_3d;
        tol = 1.0;
        it_max = 1;
        xx = 1.0;
        pp._4_4_ = (int)(_it * (a + b) + rx);
        temp = local_90 / _it;
        term = rx - 1.0;
        if (pp._4_4_ == 0) {
          temp = local_90;
        }
        iStack_38 = 0;
        while( true ) {
          iStack_38 = iStack_38 + 1;
          if (1000 < iStack_38) {
            std::operator<<((ostream *)&std::cerr,"\n");
            std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
            std::operator<<((ostream *)&std::cerr,"  Maximum number of iterations exceeded!\n");
            poVar1 = std::operator<<((ostream *)&std::cerr,"  IT_MAX = ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000);
            std::operator<<(poVar1,"\n");
            exit(1);
          }
          tol = (tol * term * temp) / (psq + (double)it_max);
          xx = xx + tol;
          if ((ABS(tol) <= 1e-07) && (ABS(tol) <= xx * 1e-07)) break;
          it_max = it_max + 1;
          pp._4_4_ = pp._4_4_ + -1;
          if (pp._4_4_ < 0) {
            term = qq;
            qq = qq + 1.0;
          }
          else {
            term = rx - (double)it_max;
            if (pp._4_4_ == 0) {
              temp = local_90;
            }
          }
        }
        dVar2 = log(local_90);
        dVar3 = log(_it);
        dVar2 = exp(psq * dVar2 + (rx - 1.0) * dVar3);
        dVar3 = r8_beta(a,b);
        xx = (xx * dVar2) / (dVar3 * psq);
        if (local_3d) {
          xx = 1.0 - xx;
        }
        a_local = xx;
      }
      else {
        a_local = 1.0;
      }
    }
    else {
      a_local = 0.0;
    }
    return a_local;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  B <= 0.\n");
  exit(1);
}

Assistant:

double beta_inc ( double a, double b, double x )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_INC returns the value of the incomplete Beta function.
//
//  Discussion:
//
//    This calculation requires an iteration.  In some cases, the iteration
//    may not converge rapidly, or may become inaccurate.
//
//    BETA_INC(A,B,X)
//
//      =   Integral ( 0 <= T <= X ) T^(A-1) (1-T)^(B-1) dT
//        / Integral ( 0 <= T <= 1 ) T^(A-1) (1-T)^(B-1) dT
//
//      =   Integral ( 0 <= T <= X ) T^(A-1) (1-T)^(B-1) dT
//        / BETA(A,B)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Majumder, Bhattacharjee.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Majumder, Bhattacharjee,
//    Algorithm AS63,
//    Applied Statistics,
//    1973, volume 22, number 3.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the function.
//    0.0 < A,
//    0.0 < B.
//
//    Input, double X, the argument of the function.
//    Normally, 0.0 <= X <= 1.0.
//
//    Output, double BETA_INC, the value of the function.
//
{
  double cx;
  int i;
  int it;
  int it_max = 1000;
  bool indx;
  int ns;
  double pp;
  double psq;
  double qq;
  double rx;
  double temp;
  double term;
  double tol = 1.0E-07;
  double value;
  double xx;

  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_INC - Fatal error!\n";
    cerr << "  A <= 0.\n";
    exit ( 1 );
  }

  if ( b <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_INC - Fatal error!\n";
    cerr << "  B <= 0.\n";
    exit ( 1 );
  }

  if ( x <= 0.0 )
  {
    value = 0.0;
    return value;
  }
  else if ( 1.0 <= x )
  {
    value = 1.0;
    return value;
  }
//
//  Change tail if necessary and determine S.
//
  psq = a + b;

  if ( a < ( a + b ) * x )
  {
    xx = 1.0 - x;
    cx = x;
    pp = b;
    qq = a;
    indx = true;
  }
  else
  {
    xx = x;
    cx = 1.0 - x;
    pp = a;
    qq = b;
    indx = false;
  }

  term = 1.0;
  i = 1;
  value = 1.0;

  ns = static_cast<int>( qq + cx * ( a + b ) );
//
//  Use Soper's reduction formulas.
//
  rx = xx / cx;

  temp = qq - static_cast<double>(i);
  if ( ns == 0 )
  {
    rx = xx;
  }

  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    if ( it_max < it )
    {
      cerr << "\n";
      cerr << "BETA_INC - Fatal error!\n";
      cerr << "  Maximum number of iterations exceeded!\n";
      cerr << "  IT_MAX = " << it_max << "\n";
      exit ( 1 );
    }

    term = term * temp * rx / ( pp + static_cast<double>(i ) );
    value = value + term;
    temp = fabs ( term );

    if ( temp <= tol && temp <= tol * value )
    {
      break;
    }

    i = i + 1;
    ns = ns - 1;

    if ( 0 <= ns )
    {
      temp = qq - static_cast< double > ( i);
      if ( ns == 0 )
      {
        rx = xx;
      }
    }
    else
    {
      temp = psq;
      psq = psq + 1.0;
    }
  }
//
//  Finish calculation.
//
  value = value * exp ( pp * log ( xx )
    + ( qq - 1.0 ) * log ( cx ) ) / ( r8_beta ( a, b ) * pp );

  if ( indx )
  {
    value = 1.0 - value;
  }

  return value;
}